

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic.hpp
# Opt level: O3

float duckdb::GetInternalCValue<float,duckdb::TryCast>(duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  float fVar2;
  
  bVar1 = CanFetchValue(result,col,row);
  if (bVar1) {
    switch(result->deprecated_columns[col].deprecated_type) {
    case DUCKDB_TYPE_BOOLEAN:
      fVar2 = TryCastCInternal<bool,float,duckdb::TryCast>(result,col,row);
      return fVar2;
    case DUCKDB_TYPE_TINYINT:
      fVar2 = TryCastCInternal<signed_char,float,duckdb::TryCast>(result,col,row);
      return fVar2;
    case DUCKDB_TYPE_SMALLINT:
      fVar2 = TryCastCInternal<short,float,duckdb::TryCast>(result,col,row);
      return fVar2;
    case DUCKDB_TYPE_INTEGER:
      fVar2 = TryCastCInternal<int,float,duckdb::TryCast>(result,col,row);
      return fVar2;
    case DUCKDB_TYPE_BIGINT:
      fVar2 = TryCastCInternal<long,float,duckdb::TryCast>(result,col,row);
      return fVar2;
    case DUCKDB_TYPE_UTINYINT:
      fVar2 = TryCastCInternal<unsigned_char,float,duckdb::TryCast>(result,col,row);
      return fVar2;
    case DUCKDB_TYPE_USMALLINT:
      fVar2 = TryCastCInternal<unsigned_short,float,duckdb::TryCast>(result,col,row);
      return fVar2;
    case DUCKDB_TYPE_UINTEGER:
      fVar2 = TryCastCInternal<unsigned_int,float,duckdb::TryCast>(result,col,row);
      return fVar2;
    case DUCKDB_TYPE_UBIGINT:
      fVar2 = TryCastCInternal<unsigned_long,float,duckdb::TryCast>(result,col,row);
      return fVar2;
    case DUCKDB_TYPE_FLOAT:
      fVar2 = TryCastCInternal<float,float,duckdb::TryCast>(result,col,row);
      return fVar2;
    case DUCKDB_TYPE_DOUBLE:
      fVar2 = TryCastCInternal<double,float,duckdb::TryCast>(result,col,row);
      return fVar2;
    case DUCKDB_TYPE_TIMESTAMP:
      fVar2 = TryCastCInternal<duckdb::timestamp_t,float,duckdb::TryCast>(result,col,row);
      return fVar2;
    case DUCKDB_TYPE_DATE:
      fVar2 = TryCastCInternal<duckdb::date_t,float,duckdb::TryCast>(result,col,row);
      return fVar2;
    case DUCKDB_TYPE_TIME:
      fVar2 = TryCastCInternal<duckdb::dtime_t,float,duckdb::TryCast>(result,col,row);
      return fVar2;
    case DUCKDB_TYPE_INTERVAL:
      fVar2 = TryCastCInternal<duckdb::interval_t,float,duckdb::TryCast>(result,col,row);
      return fVar2;
    case DUCKDB_TYPE_HUGEINT:
      fVar2 = TryCastCInternal<duckdb::hugeint_t,float,duckdb::TryCast>(result,col,row);
      return fVar2;
    case DUCKDB_TYPE_VARCHAR:
      fVar2 = TryCastCInternal<char*,float,duckdb::FromCStringCastWrapper<duckdb::TryCast>>
                        (result,col,row);
      return fVar2;
    case DUCKDB_TYPE_DECIMAL:
      fVar2 = TryCastDecimalCInternal<float>(result,col,row);
      return fVar2;
    case DUCKDB_TYPE_UHUGEINT:
      fVar2 = TryCastCInternal<duckdb::uhugeint_t,float,duckdb::TryCast>(result,col,row);
      return fVar2;
    }
  }
  return 0.0;
}

Assistant:

RESULT_TYPE GetInternalCValue(duckdb_result *result, idx_t col, idx_t row) {
	if (!CanFetchValue(result, col, row)) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	switch (result->deprecated_columns[col].deprecated_type) {
	case DUCKDB_TYPE_BOOLEAN:
		return TryCastCInternal<bool, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TINYINT:
		return TryCastCInternal<int8_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_SMALLINT:
		return TryCastCInternal<int16_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_INTEGER:
		return TryCastCInternal<int32_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_BIGINT:
		return TryCastCInternal<int64_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UTINYINT:
		return TryCastCInternal<uint8_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_USMALLINT:
		return TryCastCInternal<uint16_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UINTEGER:
		return TryCastCInternal<uint32_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UBIGINT:
		return TryCastCInternal<uint64_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_FLOAT:
		return TryCastCInternal<float, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DOUBLE:
		return TryCastCInternal<double, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DATE:
		return TryCastCInternal<date_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TIME:
		return TryCastCInternal<dtime_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TIMESTAMP:
		return TryCastCInternal<timestamp_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_HUGEINT:
		return TryCastCInternal<hugeint_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UHUGEINT:
		return TryCastCInternal<uhugeint_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DECIMAL:
		return TryCastDecimalCInternal<RESULT_TYPE>(result, col, row);
	case DUCKDB_TYPE_INTERVAL:
		return TryCastCInternal<interval_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_VARCHAR:
		return TryCastCInternal<char *, RESULT_TYPE, FromCStringCastWrapper<OP>>(result, col, row);
	case DUCKDB_TYPE_BLOB:
		return TryCastCInternal<duckdb_blob, RESULT_TYPE, FromCBlobCastWrapper>(result, col, row);
	default: { // LCOV_EXCL_START
		// Invalid type for C to C++ conversion. Internally, we set the null mask to NULL.
		// This is a deprecated code path. Use the Vector Interface for nested and complex types.
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	} // LCOV_EXCL_STOP
	}
}